

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

int css(double *inp,int N,int optmethod,int p,int d,int q,double *phi,double *theta,double *wmean,
       double *var,double *resid,double *loglik,double *hess)

{
  int N_00;
  int iVar1;
  double *oup;
  double *xi;
  double *xf;
  double *col;
  double *dx_00;
  int *ipiv_00;
  double dVar2;
  undefined1 local_90 [8];
  custom_function fcss_min;
  alik_css_object obj;
  double maxstep;
  int *ipiv;
  double *thess;
  double *dx;
  double *x;
  double *tf;
  double *b;
  int ret;
  int M;
  int length;
  int retval;
  int pq;
  int i;
  int q_local;
  int d_local;
  int p_local;
  int optmethod_local;
  int N_local;
  double *inp_local;
  
  oup = (double *)malloc((long)(N - d) << 3);
  if (d < 1) {
    dVar2 = mean(inp,N);
    *wmean = dVar2;
    for (retval = 0; p_local = N, retval < N; retval = retval + 1) {
      oup[retval] = inp[retval];
    }
  }
  else {
    p_local = diff(inp,N,d,oup);
    *wmean = 0.0;
  }
  fcss_min.params = alik_css_init(p,d,q,p_local);
  N_00 = ((alik_css_object)fcss_min.params)->pq;
  xi = (double *)malloc((long)N_00 << 3);
  xf = (double *)malloc((long)N_00 << 3);
  col = (double *)malloc((long)N_00 * 8 * (long)N_00);
  dx_00 = (double *)malloc((long)N_00 << 3);
  ipiv_00 = (int *)malloc((long)N_00 << 2);
  *(int *)((long)fcss_min.params + 0x18) = p_local;
  *(double *)((long)fcss_min.params + 0x28) = *wmean;
  for (retval = 0; retval < p; retval = retval + 1) {
    xi[retval] = 0.0;
  }
  for (retval = 0; retval < q; retval = retval + 1) {
    xi[p + retval] = 0.0;
  }
  if (*(int *)((long)fcss_min.params + 0x1c) == 1) {
    xi[p + q] = *(double *)((long)fcss_min.params + 0x28);
  }
  for (retval = 0; retval < p_local; retval = retval + 1) {
    dVar2 = oup[retval];
    *(double *)((long)fcss_min.params + (long)(p_local * 2 + retval) * 8 + 0x680) = dVar2;
    *(double *)((long)fcss_min.params + (long)retval * 8 + 0x680) = dVar2;
  }
  for (retval = p_local; SBORROW4(retval,p_local * 2) != retval + p_local * -2 < 0;
      retval = retval + 1) {
    *(undefined8 *)((long)fcss_min.params + (long)retval * 8 + 0x680) = 0;
  }
  local_90 = (undefined1  [8])fcss;
  fcss_min.funcpt = (_func_double_double_ptr_int_void_ptr *)fcss_min.params;
  iVar1 = fminunc((custom_function *)local_90,(custom_gradient *)0x0,N_00,xi,1.0,optmethod,xf);
  if (iVar1 == 0) {
    b._4_4_ = 0;
  }
  else if (iVar1 == 0xf) {
    b._4_4_ = 0xf;
  }
  else if (iVar1 == 4) {
    b._4_4_ = 4;
  }
  else {
    b._4_4_ = 1;
  }
  for (retval = 0; retval < N_00; retval = retval + 1) {
    dx_00[retval] = 1.0;
  }
  hessian_fd((custom_function *)local_90,xf,N_00,dx_00,*(double *)((long)fcss_min.params + 0x20),
             hess);
  mtranspose(hess,N_00,N_00,col);
  for (retval = 0; retval < N_00 * N_00; retval = retval + 1) {
    col[retval] = (double)(p_local - d) * 0.5 * (hess[retval] + col[retval]);
  }
  ludecomp(col,N_00,ipiv_00);
  minverse(col,N_00,ipiv_00,hess);
  for (retval = 0; retval < p; retval = retval + 1) {
    phi[retval] = xf[retval];
  }
  for (retval = 0; retval < q; retval = retval + 1) {
    theta[retval] = -xf[p + retval];
  }
  if (*(int *)((long)fcss_min.params + 0x1c) == 1) {
    *wmean = xf[p + q];
  }
  else {
    *wmean = 0.0;
  }
  *var = *(double *)((long)fcss_min.params + 0x30) / (double)p_local;
  for (retval = 0; retval < p_local - d; retval = retval + 1) {
    resid[retval] = *(double *)((long)fcss_min.params + (long)(p_local + retval) * 8 + 0x680);
  }
  *loglik = *(double *)((long)fcss_min.params + 0x38);
  free(xi);
  free(xf);
  free(oup);
  free(col);
  free(dx_00);
  free(ipiv_00);
  free_alik_css((alik_css_object)fcss_min.params);
  return b._4_4_;
}

Assistant:

int css(double *inp, int N, int optmethod, int p, int d, int q, double *phi, double *theta, double *wmean,double *var,double *resid,double *loglik,double *hess) {
	int i, pq, retval, length,M,ret;
	double *b, *tf, *x,*dx,*thess;
	int *ipiv;
	double maxstep;
	alik_css_object obj;

	x = (double*)malloc(sizeof(double)* (N - d));


	length = N;

	maxstep = 1.0;

	/*

	*/

	if (d > 0) {
		N = diff(inp, N, d, x); // No need to demean x
		M = 0;
		*wmean = 0.0;
	}
	else {
		*wmean = mean(inp, N);
		for (i = 0; i < N; ++i) {
			x[i] = inp[i];
		}
		M = 1;
	}

	obj = alik_css_init(p, d, q, N);
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	obj->N = N;
	obj->mean = *wmean;


	for (i = 0; i < p; ++i) {
		b[i] = 0.0;
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = 0.0;
	}

	if (obj->M == 1) {
		b[p + q] = obj->mean;
	}

	for (i = 0; i < N; ++i) {
		obj->x[i] = obj->x[2*N+i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[i] = 0.0;
	}

	custom_function fcss_min = { fcss, obj };
	retval = fminunc(&fcss_min, NULL, pq, b, maxstep, optmethod, tf);

	if (retval == 0) {
		ret = 0;
	} else if (retval == 15) {
		ret = 15;
	} else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq; ++i) {
		dx[i] = 1.0;
	}

	hessian_fd(&fcss_min, tf, pq, dx, obj->eps, hess);
	//mdisplay(hess, pq, pq);
	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (N - d) * 0.5 * (hess[i] + thess[i]);
	}


	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);

	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	if (obj->M == 1) {
		*wmean = tf[p + q];
	}
	else {
		*wmean = 0.0;
	}
	/*
	if (M == 1) {
		temp = 0.0;
		for (i = 0; i < p; ++i) {
			temp += phi[i];
		}
		*wmean = *wmean * (1.0 - temp);
	}
	else {
		*wmean = 0.0;
	}
	*/
	*var = (obj->ssq) / (double)N;
	for (i = 0; i < N - d; ++i) {
		resid[i] = obj->x[N+i];
	}
	*loglik = obj->loglik;
	//printf("MEAN %g \n", mean(obj->x+N,N));
	//mdisplay(obj->x + N, 1, N);

	free(b);
	free(tf);
	free(x);
	free(thess);
	free(dx);
	free(ipiv);
	free_alik_css(obj);
	return ret;
}